

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O3

int mbedtls_ecdh_make_params
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int format;
  int iVar1;
  size_t grp_len;
  size_t pt_len;
  size_t local_40;
  size_t local_38;
  
  if ((ctx->grp).pbits != 0) {
    format = ctx->point_format;
    iVar1 = mbedtls_ecdh_gen_public(&ctx->grp,&ctx->d,&ctx->Q,f_rng,p_rng);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_tls_write_group(&ctx->grp,&local_40,buf,blen);
      if (iVar1 == 0) {
        iVar1 = mbedtls_ecp_tls_write_point
                          (&ctx->grp,&ctx->Q,format,&local_38,buf + local_40,blen - local_40);
        if (iVar1 == 0) {
          *olen = local_38 + local_40;
          iVar1 = 0;
        }
      }
    }
    return iVar1;
  }
  return -0x4f80;
}

Assistant:

static int ecdh_make_params_internal( mbedtls_ecdh_context_mbed *ctx,
                                      size_t *olen, int point_format,
                                      unsigned char *buf, size_t blen,
                                      int (*f_rng)(void *,
                                                   unsigned char *,
                                                   size_t),
                                      void *p_rng,
                                      int restart_enabled )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t grp_len, pt_len;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    mbedtls_ecp_restart_ctx *rs_ctx = NULL;
#endif

    if( ctx->grp.pbits == 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( restart_enabled )
        rs_ctx = &ctx->rs;
#else
    (void) restart_enabled;
#endif


#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( ( ret = ecdh_gen_public_restartable( &ctx->grp, &ctx->d, &ctx->Q,
                                             f_rng, p_rng, rs_ctx ) ) != 0 )
        return( ret );
#else
    if( ( ret = mbedtls_ecdh_gen_public( &ctx->grp, &ctx->d, &ctx->Q,
                                         f_rng, p_rng ) ) != 0 )
        return( ret );
#endif /* MBEDTLS_ECP_RESTARTABLE */

    if( ( ret = mbedtls_ecp_tls_write_group( &ctx->grp, &grp_len, buf,
                                             blen ) ) != 0 )
        return( ret );

    buf += grp_len;
    blen -= grp_len;

    if( ( ret = mbedtls_ecp_tls_write_point( &ctx->grp, &ctx->Q, point_format,
                                             &pt_len, buf, blen ) ) != 0 )
        return( ret );

    *olen = grp_len + pt_len;
    return( 0 );
}